

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlkf.cpp
# Opt level: O1

void __thiscall icu_63::LocaleKeyFactory::~LocaleKeyFactory(LocaleKeyFactory *this)

{
  void *in_RSI;
  
  (this->super_ICUServiceFactory).super_UObject._vptr_UObject =
       (_func_int **)&PTR__LocaleKeyFactory_003ddda0;
  UnicodeString::~UnicodeString(&this->_name);
  ICUServiceFactory::~ICUServiceFactory(&this->super_ICUServiceFactory);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

UObject*
LocaleKeyFactory::create(const ICUServiceKey& key, const ICUService* service, UErrorCode& status) const {
    if (handlesKey(key, status)) {
        const LocaleKey& lkey = (const LocaleKey&)key;
        int32_t kind = lkey.kind();
        Locale loc;
        lkey.currentLocale(loc);

        return handleCreate(loc, kind, service, status);
    }
    return NULL;
}